

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

void lchown_cb(uv_fs_t *req)

{
  int iVar1;
  uv_loop_t *puVar2;
  uv_loop_t *puVar3;
  char *loop;
  uv_buf_t uVar4;
  uv_fs_t uStackY_3a8;
  uv_loop_t *puStackY_1f0;
  code *pcStackY_1e8;
  uv_loop_t *puStack_178;
  
  if (req->fs_type == UV_FS_LCHOWN) {
    if (req->result == 0) {
      lchown_cb_count = lchown_cb_count + 1;
      uv_fs_req_cleanup(req);
      return;
    }
  }
  else {
    lchown_cb_cold_1();
  }
  lchown_cb_cold_2();
  puVar3 = (uv_loop_t *)0x1a3557;
  pcStackY_1e8 = (code *)0x15bd30;
  unlink("test_file");
  pcStackY_1e8 = (code *)0x15bd3c;
  unlink("test_file_link");
  pcStackY_1e8 = (code *)0x15bd48;
  unlink("test_file_link2");
  pcStackY_1e8 = (code *)0x15bd4d;
  ::loop = uv_default_loop();
  loop = (char *)0x0;
  pcStackY_1e8 = (code *)0x15bd71;
  iVar1 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe30,"test_file",0x42,0x180,
                     (uv_fs_cb)0x0);
  puVar2 = puStack_178;
  if (iVar1 < 0) {
    pcStackY_1e8 = (code *)0x15c0b4;
    run_test_fs_link_cold_1();
LAB_0015c0b4:
    pcStackY_1e8 = (code *)0x15c0b9;
    run_test_fs_link_cold_2();
LAB_0015c0b9:
    pcStackY_1e8 = (code *)0x15c0be;
    run_test_fs_link_cold_3();
LAB_0015c0be:
    pcStackY_1e8 = (code *)0x15c0c3;
    run_test_fs_link_cold_4();
LAB_0015c0c3:
    pcStackY_1e8 = (code *)0x15c0c8;
    run_test_fs_link_cold_5();
LAB_0015c0c8:
    pcStackY_1e8 = (code *)0x15c0cd;
    run_test_fs_link_cold_6();
LAB_0015c0cd:
    puVar2 = puVar3;
    pcStackY_1e8 = (code *)0x15c0d2;
    run_test_fs_link_cold_7();
LAB_0015c0d2:
    pcStackY_1e8 = (code *)0x15c0d7;
    run_test_fs_link_cold_8();
LAB_0015c0d7:
    pcStackY_1e8 = (code *)0x15c0dc;
    run_test_fs_link_cold_9();
LAB_0015c0dc:
    pcStackY_1e8 = (code *)0x15c0e1;
    run_test_fs_link_cold_10();
LAB_0015c0e1:
    pcStackY_1e8 = (code *)0x15c0e6;
    run_test_fs_link_cold_11();
LAB_0015c0e6:
    pcStackY_1e8 = (code *)0x15c0eb;
    run_test_fs_link_cold_12();
LAB_0015c0eb:
    pcStackY_1e8 = (code *)0x15c0f0;
    run_test_fs_link_cold_13();
LAB_0015c0f0:
    puVar3 = puVar2;
    pcStackY_1e8 = (code *)0x15c0f5;
    run_test_fs_link_cold_14();
LAB_0015c0f5:
    pcStackY_1e8 = (code *)0x15c0fa;
    run_test_fs_link_cold_15();
LAB_0015c0fa:
    pcStackY_1e8 = (code *)0x15c0ff;
    run_test_fs_link_cold_16();
LAB_0015c0ff:
    pcStackY_1e8 = (code *)0x15c104;
    run_test_fs_link_cold_17();
LAB_0015c104:
    pcStackY_1e8 = (code *)0x15c109;
    run_test_fs_link_cold_18();
  }
  else {
    puVar3 = puStack_178;
    if ((long)puStack_178 < 0) goto LAB_0015c0b4;
    pcStackY_1e8 = (code *)0x15bd94;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe30);
    pcStackY_1e8 = (code *)0x15bda5;
    iov = uv_buf_init(test_buf,0xd);
    loop = (char *)0x0;
    pcStackY_1e8 = (code *)0x15bddb;
    iVar1 = uv_fs_write((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe30,(uv_file)puVar2,&iov,1,
                        -1,(uv_fs_cb)0x0);
    puVar3 = puVar2;
    if (iVar1 != 0xd) goto LAB_0015c0b9;
    if (puStack_178 != (uv_loop_t *)0xd) goto LAB_0015c0be;
    pcStackY_1e8 = (code *)0x15bdfd;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe30);
    pcStackY_1e8 = (code *)0x15be10;
    uv_fs_close(::loop,(uv_fs_t *)&stack0xfffffffffffffe30,(uv_file)puVar2,(uv_fs_cb)0x0);
    loop = (char *)0x0;
    pcStackY_1e8 = (code *)0x15be2b;
    iVar1 = uv_fs_link((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe30,"test_file",
                       "test_file_link",(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_0015c0c3;
    if (puStack_178 != (uv_loop_t *)0x0) goto LAB_0015c0c8;
    pcStackY_1e8 = (code *)0x15be4c;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe30);
    loop = (char *)0x0;
    pcStackY_1e8 = (code *)0x15be68;
    iVar1 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe30,"test_file_link",2,0,
                       (uv_fs_cb)0x0);
    puVar2 = puStack_178;
    puVar3 = (uv_loop_t *)&stack0xfffffffffffffe30;
    if (iVar1 < 0) goto LAB_0015c0cd;
    if ((long)puStack_178 < 0) goto LAB_0015c0d2;
    pcStackY_1e8 = (code *)0x15be8b;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe30);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStackY_1e8 = (code *)0x15bead;
    uVar4 = uv_buf_init(buf,0x20);
    loop = (char *)0x0;
    pcStackY_1e8 = (code *)0x15bedf;
    iov = uVar4;
    iVar1 = uv_fs_read((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe30,(uv_file)puVar2,&iov,1,0
                       ,(uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_0015c0d7;
    if ((long)puStack_178 < 0) goto LAB_0015c0dc;
    loop = buf;
    pcStackY_1e8 = (code *)0x15bf06;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_0015c0e1;
    pcStackY_1e8 = (code *)0x15bf15;
    close((uv_file)puVar2);
    pcStackY_1e8 = (code *)0x15bf3b;
    loop = (char *)::loop;
    iVar1 = uv_fs_link(::loop,(uv_fs_t *)&stack0xfffffffffffffe30,"test_file","test_file_link2",
                       link_cb);
    if (iVar1 != 0) goto LAB_0015c0e6;
    pcStackY_1e8 = (code *)0x15bf51;
    loop = (char *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (link_cb_count != 1) goto LAB_0015c0eb;
    loop = (char *)0x0;
    pcStackY_1e8 = (code *)0x15bf7c;
    iVar1 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe30,"test_file_link2",2,0,
                       (uv_fs_cb)0x0);
    puVar3 = puStack_178;
    if (iVar1 < 0) goto LAB_0015c0f0;
    if ((long)puStack_178 < 0) goto LAB_0015c0f5;
    pcStackY_1e8 = (code *)0x15bf9f;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe30);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStackY_1e8 = (code *)0x15bfc1;
    uVar4 = uv_buf_init(buf,0x20);
    loop = (char *)0x0;
    pcStackY_1e8 = (code *)0x15bff3;
    iov = uVar4;
    iVar1 = uv_fs_read((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe30,(uv_file)puVar3,&iov,1,0
                       ,(uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_0015c0fa;
    if ((long)puStack_178 < 0) goto LAB_0015c0ff;
    loop = buf;
    pcStackY_1e8 = (code *)0x15c01a;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_0015c104;
    pcStackY_1e8 = (code *)0x15c037;
    uv_fs_close(::loop,(uv_fs_t *)&stack0xfffffffffffffe30,(uv_file)puVar3,(uv_fs_cb)0x0);
    pcStackY_1e8 = (code *)0x15c045;
    uv_run(::loop,UV_RUN_DEFAULT);
    pcStackY_1e8 = (code *)0x15c051;
    unlink("test_file");
    pcStackY_1e8 = (code *)0x15c05d;
    unlink("test_file_link");
    pcStackY_1e8 = (code *)0x15c069;
    unlink("test_file_link2");
    pcStackY_1e8 = (code *)0x15c06e;
    puVar3 = uv_default_loop();
    pcStackY_1e8 = (code *)0x15c082;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    pcStackY_1e8 = (code *)0x15c08c;
    uv_run(puVar3,UV_RUN_DEFAULT);
    pcStackY_1e8 = (code *)0x15c091;
    loop = (char *)uv_default_loop();
    pcStackY_1e8 = (code *)0x15c099;
    iVar1 = uv_loop_close((uv_loop_t *)loop);
    if (iVar1 == 0) {
      pcStackY_1e8 = (code *)0x15c0a2;
      uv_library_shutdown();
      return;
    }
  }
  pcStackY_1e8 = link_cb;
  run_test_fs_link_cold_19();
  if (((uv_loop_t *)loop)->backend_fd == 0x17) {
    if (((uv_loop_t *)loop)->watcher_queue[0] == (void *)0x0) {
      link_cb_count = link_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)loop);
      return;
    }
  }
  else {
    puStackY_1f0 = (uv_loop_t *)0x15c12d;
    link_cb_cold_1();
  }
  puStackY_1f0 = (uv_loop_t *)run_test_fs_readlink;
  link_cb_cold_2();
  puStackY_1f0 = puVar3;
  ::loop = uv_default_loop();
  iVar1 = uv_fs_readlink(::loop,&uStackY_3a8,"no_such_file",dummy_cb);
  if (iVar1 == 0) {
    iVar1 = uv_run(::loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0015c230;
    if (dummy_cb_count != 1) goto LAB_0015c235;
    if (uStackY_3a8.ptr != (void *)0x0) goto LAB_0015c23a;
    if (uStackY_3a8.result != -2) goto LAB_0015c23f;
    uv_fs_req_cleanup(&uStackY_3a8);
    iVar1 = uv_fs_readlink((uv_loop_t *)0x0,&uStackY_3a8,"no_such_file",(uv_fs_cb)0x0);
    if (iVar1 != -2) goto LAB_0015c244;
    if (uStackY_3a8.ptr != (void *)0x0) goto LAB_0015c249;
    if (uStackY_3a8.result == -2) {
      uv_fs_req_cleanup(&uStackY_3a8);
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return;
      }
      goto LAB_0015c253;
    }
  }
  else {
    run_test_fs_readlink_cold_1();
LAB_0015c230:
    run_test_fs_readlink_cold_2();
LAB_0015c235:
    run_test_fs_readlink_cold_3();
LAB_0015c23a:
    run_test_fs_readlink_cold_4();
LAB_0015c23f:
    run_test_fs_readlink_cold_5();
LAB_0015c244:
    run_test_fs_readlink_cold_6();
LAB_0015c249:
    run_test_fs_readlink_cold_7();
  }
  run_test_fs_readlink_cold_8();
LAB_0015c253:
  run_test_fs_readlink_cold_9();
  dummy_cb_count = dummy_cb_count + 1;
  return;
}

Assistant:

static void lchown_cb(uv_fs_t* req) {
  ASSERT(req->fs_type == UV_FS_LCHOWN);
  ASSERT(req->result == 0);
  lchown_cb_count++;
  uv_fs_req_cleanup(req);
}